

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdqsort.h
# Opt level: O0

pair<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>,_bool>
 pdqsort_detail::
 partition_right_branchless<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,HighsCliqueTable::cliquePartition(std::vector<double,std::allocator<double>>const&,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>&,std::vector<int,std::allocator<int>>&)::__0>
           (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
            begin,__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                  end,anon_class_8_1_bccf3fd9 comp)

{
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  first_00;
  uchar uVar1;
  char cVar2;
  bool bVar3;
  reference pCVar4;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  *p_Var5;
  anon_class_8_1_bccf3fd9 *paVar6;
  unsigned_long *puVar7;
  reference pCVar8;
  CliqueVar *in_RSI;
  CliqueVar *in_RDI;
  pair<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>,_bool>
  pVar9;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  pivot_pos;
  size_t num;
  size_t i_3;
  size_t i_2;
  size_t i_1;
  size_t i;
  size_t right_split;
  size_t left_split;
  size_t num_unknown;
  size_t start_r;
  size_t start_l;
  size_t num_r;
  size_t num_l;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  offsets_r_base;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  offsets_l_base;
  uchar *offsets_r;
  uchar *offsets_l;
  uchar offsets_r_storage [128];
  uchar offsets_l_storage [128];
  bool already_partitioned;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  last;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  first;
  T pivot;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  in_stack_fffffffffffffcf8;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  in_stack_fffffffffffffd00;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  *in_stack_fffffffffffffd08;
  ulong local_2f0;
  anon_class_8_1_bccf3fd9 *in_stack_fffffffffffffd18;
  anon_class_8_1_bccf3fd9 *this;
  anon_class_8_1_bccf3fd9 *in_stack_fffffffffffffd20;
  byte local_2d1;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_2c0;
  CliqueVar *local_2b8;
  CliqueVar *local_2b0;
  undefined8 in_stack_fffffffffffffd58;
  size_t in_stack_fffffffffffffd60;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  last_00;
  CliqueVar in_stack_fffffffffffffd80;
  CliqueVar in_stack_fffffffffffffd84;
  ulong local_278;
  ulong local_230;
  anon_class_8_1_bccf3fd9 *local_220;
  ulong local_1d8;
  undefined1 *local_1b8;
  undefined1 *local_1b0;
  unsigned_long local_1a8;
  unsigned_long local_1a0;
  CliqueVar *local_198;
  CliqueVar *local_190;
  uchar *local_188;
  uchar *local_180;
  uchar local_178 [128];
  uchar local_f8 [128];
  CliqueVar *local_78;
  CliqueVar *local_70;
  undefined1 local_61;
  CliqueVar local_60;
  CliqueVar local_5c;
  CliqueVar local_58;
  CliqueVar local_54;
  CliqueVar *local_50;
  CliqueVar local_48;
  CliqueVar local_44;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_40;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_38;
  CliqueVar local_2c;
  CliqueVar *local_20;
  __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
  local_18 [3];
  
  local_20 = in_RSI;
  local_18[0]._M_current = in_RDI;
  pCVar4 = __gnu_cxx::
           __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
           ::operator*(local_18);
  local_2c = *pCVar4;
  local_38._M_current = local_18[0]._M_current;
  local_40._M_current = local_20;
  do {
    p_Var5 = __gnu_cxx::
             __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
             ::operator++(&local_38);
    pCVar4 = __gnu_cxx::
             __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
             ::operator*(p_Var5);
    local_44 = *pCVar4;
    local_48 = local_2c;
    bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                      (in_stack_fffffffffffffd18,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                       SUB84(in_stack_fffffffffffffd20,0));
  } while (bVar3);
  local_50 = (CliqueVar *)
             __gnu_cxx::
             __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
             ::operator-(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00._M_current);
  bVar3 = __gnu_cxx::operator==
                    ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                      *)in_stack_fffffffffffffd00._M_current,
                     (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                      *)in_stack_fffffffffffffcf8._M_current);
  if (bVar3) {
    do {
      bVar3 = __gnu_cxx::operator<
                        ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)in_stack_fffffffffffffd00._M_current,
                         (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                          *)in_stack_fffffffffffffcf8._M_current);
      local_2d1 = 0;
      if (bVar3) {
        p_Var5 = __gnu_cxx::
                 __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                 ::operator--(&local_40);
        pCVar4 = __gnu_cxx::
                 __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                 ::operator*(p_Var5);
        local_54 = *pCVar4;
        local_58 = local_2c;
        bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                          (in_stack_fffffffffffffd18,
                           SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                           SUB84(in_stack_fffffffffffffd20,0));
        local_2d1 = bVar3 ^ 0xff;
      }
    } while ((local_2d1 & 1) != 0);
  }
  else {
    do {
      p_Var5 = __gnu_cxx::
               __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
               ::operator--(&local_40);
      pCVar4 = __gnu_cxx::
               __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
               ::operator*(p_Var5);
      local_5c = *pCVar4;
      local_60 = local_2c;
      bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                        (in_stack_fffffffffffffd18,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0)
                         ,SUB84(in_stack_fffffffffffffd20,0));
    } while (((bVar3 ^ 0xffU) & 1) != 0);
  }
  local_61 = __gnu_cxx::operator>=
                       ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                         *)in_stack_fffffffffffffd00._M_current,
                        (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                         *)in_stack_fffffffffffffcf8._M_current);
  if (!(bool)local_61) {
    local_70 = local_38._M_current;
    local_78 = local_40._M_current;
    std::
    iter_swap<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>>
              (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
    __gnu_cxx::
    __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
    ::operator++(&local_38);
    local_180 = align_cacheline<unsigned_char>(local_f8);
    local_188 = align_cacheline<unsigned_char>(local_178);
    local_190 = local_38._M_current;
    local_198 = local_40._M_current;
    local_1b8 = (undefined1 *)0x0;
    local_1b0 = (undefined1 *)0x0;
    local_1a8 = 0;
    local_1a0 = 0;
    while (bVar3 = __gnu_cxx::operator<
                             ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                               *)in_stack_fffffffffffffd00._M_current,
                              (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                               *)in_stack_fffffffffffffcf8._M_current), bVar3) {
      paVar6 = (anon_class_8_1_bccf3fd9 *)
               __gnu_cxx::operator-
                         ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                           *)in_stack_fffffffffffffd00._M_current,
                          (__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                           *)in_stack_fffffffffffffcf8._M_current);
      if (local_1a0 == 0) {
        this = paVar6;
        in_stack_fffffffffffffd20 = paVar6;
        if (local_1a8 == 0) {
          this = (anon_class_8_1_bccf3fd9 *)((ulong)paVar6 >> 1);
          in_stack_fffffffffffffd20 = (anon_class_8_1_bccf3fd9 *)((ulong)paVar6 >> 1);
        }
      }
      else {
        this = (anon_class_8_1_bccf3fd9 *)0x0;
      }
      if (local_1a8 == 0) {
        local_2f0 = (long)paVar6 - (long)this;
      }
      else {
        local_2f0 = 0;
      }
      if (this < (anon_class_8_1_bccf3fd9 *)0x40) {
        paVar6 = this;
        for (local_220 = (anon_class_8_1_bccf3fd9 *)0x0; local_220 < this;
            local_220 = (anon_class_8_1_bccf3fd9 *)((long)&local_220->objective + 1)) {
          local_180[local_1a0] = (uchar)local_220;
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator*(&local_38);
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            (paVar6,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                             SUB84(in_stack_fffffffffffffd20,0));
          local_1a0 = ((bVar3 ^ 0xffU) & 1) + local_1a0;
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator++(&local_38);
        }
      }
      else {
        local_1d8 = 0;
        while (paVar6 = this, local_1d8 < 0x40) {
          uVar1 = (uchar)local_1d8;
          local_180[local_1a0] = uVar1;
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator*(&local_38);
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            (this,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                             SUB84(in_stack_fffffffffffffd20,0));
          local_1a0 = ((bVar3 ^ 0xffU) & 1) + local_1a0;
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator++(&local_38);
          local_180[local_1a0] = uVar1 + '\x01';
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator*(&local_38);
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            (this,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                             SUB84(in_stack_fffffffffffffd20,0));
          local_1a0 = ((bVar3 ^ 0xffU) & 1) + local_1a0;
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator++(&local_38);
          local_180[local_1a0] = uVar1 + '\x02';
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator*(&local_38);
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            (this,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                             SUB84(in_stack_fffffffffffffd20,0));
          local_1a0 = ((bVar3 ^ 0xffU) & 1) + local_1a0;
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator++(&local_38);
          local_180[local_1a0] = uVar1 + '\x03';
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator*(&local_38);
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            (this,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                             SUB84(in_stack_fffffffffffffd20,0));
          local_1a0 = ((bVar3 ^ 0xffU) & 1) + local_1a0;
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator++(&local_38);
          local_180[local_1a0] = uVar1 + '\x04';
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator*(&local_38);
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            (this,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                             SUB84(in_stack_fffffffffffffd20,0));
          local_1a0 = ((bVar3 ^ 0xffU) & 1) + local_1a0;
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator++(&local_38);
          local_180[local_1a0] = uVar1 + '\x05';
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator*(&local_38);
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            (this,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                             SUB84(in_stack_fffffffffffffd20,0));
          local_1a0 = ((bVar3 ^ 0xffU) & 1) + local_1a0;
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator++(&local_38);
          local_180[local_1a0] = uVar1 + '\x06';
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator*(&local_38);
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            (this,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                             SUB84(in_stack_fffffffffffffd20,0));
          local_1a0 = ((bVar3 ^ 0xffU) & 1) + local_1a0;
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator++(&local_38);
          local_1d8 = local_1d8 + 8;
          local_180[local_1a0] = uVar1 + '\a';
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator*(&local_38);
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            (this,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                             SUB84(in_stack_fffffffffffffd20,0));
          local_1a0 = ((bVar3 ^ 0xffU) & 1) + local_1a0;
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator++(&local_38);
        }
      }
      if (local_2f0 < 0x40) {
        local_278 = 0;
        while (local_278 < local_2f0) {
          local_278 = local_278 + 1;
          local_188[local_1a8] = (uchar)local_278;
          p_Var5 = __gnu_cxx::
                   __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                   ::operator--(&local_40);
          pCVar4 = __gnu_cxx::
                   __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                   ::operator*(p_Var5);
          in_stack_fffffffffffffd84 = *pCVar4;
          in_stack_fffffffffffffd80 = local_2c;
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            (paVar6,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                             SUB84(in_stack_fffffffffffffd20,0));
          local_1a8 = bVar3 + local_1a8;
        }
      }
      else {
        local_230 = 0;
        while (local_230 < 0x40) {
          cVar2 = (char)local_230;
          local_188[local_1a8] = cVar2 + '\x01';
          p_Var5 = __gnu_cxx::
                   __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                   ::operator--(&local_40);
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator*(p_Var5);
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            (paVar6,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                             SUB84(in_stack_fffffffffffffd20,0));
          local_1a8 = bVar3 + local_1a8;
          local_188[local_1a8] = cVar2 + '\x02';
          p_Var5 = __gnu_cxx::
                   __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                   ::operator--(&local_40);
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator*(p_Var5);
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            (paVar6,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                             SUB84(in_stack_fffffffffffffd20,0));
          local_1a8 = bVar3 + local_1a8;
          local_188[local_1a8] = cVar2 + '\x03';
          p_Var5 = __gnu_cxx::
                   __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                   ::operator--(&local_40);
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator*(p_Var5);
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            (paVar6,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                             SUB84(in_stack_fffffffffffffd20,0));
          local_1a8 = bVar3 + local_1a8;
          local_188[local_1a8] = cVar2 + '\x04';
          p_Var5 = __gnu_cxx::
                   __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                   ::operator--(&local_40);
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator*(p_Var5);
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            (paVar6,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                             SUB84(in_stack_fffffffffffffd20,0));
          local_1a8 = bVar3 + local_1a8;
          local_188[local_1a8] = cVar2 + '\x05';
          p_Var5 = __gnu_cxx::
                   __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                   ::operator--(&local_40);
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator*(p_Var5);
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            (paVar6,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                             SUB84(in_stack_fffffffffffffd20,0));
          local_1a8 = bVar3 + local_1a8;
          local_188[local_1a8] = cVar2 + '\x06';
          p_Var5 = __gnu_cxx::
                   __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                   ::operator--(&local_40);
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator*(p_Var5);
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            (paVar6,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                             SUB84(in_stack_fffffffffffffd20,0));
          local_1a8 = bVar3 + local_1a8;
          local_188[local_1a8] = cVar2 + '\a';
          p_Var5 = __gnu_cxx::
                   __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                   ::operator--(&local_40);
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator*(p_Var5);
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            (paVar6,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                             SUB84(in_stack_fffffffffffffd20,0));
          local_1a8 = bVar3 + local_1a8;
          local_230 = local_230 + 8;
          local_188[local_1a8] = (uchar)local_230;
          p_Var5 = __gnu_cxx::
                   __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                   ::operator--(&local_40);
          __gnu_cxx::
          __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
          ::operator*(p_Var5);
          bVar3 = HighsCliqueTable::cliquePartition::anon_class_8_1_bccf3fd9::operator()
                            (paVar6,SUB84((ulong)in_stack_fffffffffffffd20 >> 0x20,0),
                             SUB84(in_stack_fffffffffffffd20,0));
          local_1a8 = bVar3 + local_1a8;
        }
      }
      puVar7 = std::min<unsigned_long>(&local_1a0,&local_1a8);
      last_00._M_current = (CliqueVar *)*puVar7;
      first_00._M_current._4_4_ = in_stack_fffffffffffffd84;
      first_00._M_current._0_4_ = in_stack_fffffffffffffd80;
      swap_offsets<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>>
                (first_00,last_00,(uchar *)local_190,(uchar *)local_198,in_stack_fffffffffffffd60,
                 SUB81((ulong)in_stack_fffffffffffffd58 >> 0x38,0));
      local_1a0 = local_1a0 - (long)last_00._M_current;
      local_1a8 = local_1a8 - (long)last_00._M_current;
      local_1b0 = &(last_00._M_current)->field_0x0 + (long)local_1b0;
      local_1b8 = &(last_00._M_current)->field_0x0 + (long)local_1b8;
      if (local_1a0 == 0) {
        local_1b0 = (undefined1 *)0x0;
        local_190 = local_38._M_current;
      }
      if (local_1a8 == 0) {
        local_1b8 = (undefined1 *)0x0;
        local_198 = local_40._M_current;
      }
    }
    if (local_1a0 != 0) {
      local_180 = local_180 + (long)local_1b0;
      while (local_1a0 != 0) {
        local_1a0 = local_1a0 - 1;
        __gnu_cxx::
        __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
        ::operator+(in_stack_fffffffffffffd08,(difference_type)in_stack_fffffffffffffd00._M_current)
        ;
        __gnu_cxx::
        __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
        ::operator--(&local_40);
        std::
        iter_swap<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>>
                  (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
      }
      local_38._M_current = local_40._M_current;
      local_1a0 = local_1a0 - 1;
    }
    if (local_1a8 != 0) {
      local_188 = local_188 + (long)local_1b8;
      while (local_1a8 != 0) {
        local_1a8 = local_1a8 - 1;
        local_2b0 = (CliqueVar *)
                    __gnu_cxx::
                    __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                    ::operator-(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00._M_current);
        local_2b8 = local_38._M_current;
        std::
        iter_swap<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>,__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>>
                  (in_stack_fffffffffffffd00,in_stack_fffffffffffffcf8);
        __gnu_cxx::
        __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
        ::operator++(&local_38);
      }
      local_40._M_current = local_38._M_current;
      local_1a8 = local_1a8 - 1;
    }
  }
  local_2c0 = __gnu_cxx::
              __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
              ::operator-(in_stack_fffffffffffffd08,in_stack_fffffffffffffd00._M_current);
  p_Var5 = &local_2c0;
  pCVar4 = __gnu_cxx::
           __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
           ::operator*(p_Var5);
  pCVar8 = __gnu_cxx::
           __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
           ::operator*(local_18);
  *pCVar8 = *pCVar4;
  pCVar8 = __gnu_cxx::
           __normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
           ::operator*(p_Var5);
  *pCVar8 = local_2c;
  pVar9 = std::
          make_pair<__gnu_cxx::__normal_iterator<HighsCliqueTable::CliqueVar*,std::vector<HighsCliqueTable::CliqueVar,std::allocator<HighsCliqueTable::CliqueVar>>>&,bool&>
                    ((__normal_iterator<HighsCliqueTable::CliqueVar_*,_std::vector<HighsCliqueTable::CliqueVar,_std::allocator<HighsCliqueTable::CliqueVar>_>_>
                      *)pCVar4,(bool *)in_stack_fffffffffffffcf8._M_current);
  return pVar9;
}

Assistant:

inline std::pair<Iter, bool> partition_right_branchless(Iter begin, Iter end, Compare comp) {
        typedef typename std::iterator_traits<Iter>::value_type T;

        // Move pivot into local for speed.
        T pivot(PDQSORT_PREFER_MOVE(*begin));
        Iter first = begin;
        Iter last = end;

        // Find the first element greater than or equal than the pivot (the median of 3 guarantees
        // this exists).
        while (comp(*++first, pivot));

        // Find the first element strictly smaller than the pivot. We have to guard this search if
        // there was no element before *first.
        if (first - 1 == begin) while (first < last && !comp(*--last, pivot));
        else                    while (                !comp(*--last, pivot));

        // If the first pair of elements that should be swapped to partition are the same element,
        // the passed in sequence already was correctly partitioned.
        bool already_partitioned = first >= last;
        if (!already_partitioned) {
            std::iter_swap(first, last);
            ++first;

            // The following branchless partitioning is derived from "BlockQuicksort: How Branch
            // Mispredictions don’t affect Quicksort" by Stefan Edelkamp and Armin Weiss, but
            // heavily micro-optimized.
            unsigned char offsets_l_storage[block_size + cacheline_size];
            unsigned char offsets_r_storage[block_size + cacheline_size];
            unsigned char* offsets_l = align_cacheline(offsets_l_storage);
            unsigned char* offsets_r = align_cacheline(offsets_r_storage);

            Iter offsets_l_base = first;
            Iter offsets_r_base = last;
            size_t num_l, num_r, start_l, start_r;
            num_l = num_r = start_l = start_r = 0;
            
            while (first < last) {
                // Fill up offset blocks with elements that are on the wrong side.
                // First we determine how much elements are considered for each offset block.
                size_t num_unknown = last - first;
                size_t left_split = num_l == 0 ? (num_r == 0 ? num_unknown / 2 : num_unknown) : 0;
                size_t right_split = num_r == 0 ? (num_unknown - left_split) : 0;

                // Fill the offset blocks.
                if (left_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                } else {
                    for (size_t i = 0; i < left_split;) {
                        offsets_l[num_l] = i++; num_l += !comp(*first, pivot); ++first;
                    }
                }

                if (right_split >= block_size) {
                    for (size_t i = 0; i < block_size;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                } else {
                    for (size_t i = 0; i < right_split;) {
                        offsets_r[num_r] = ++i; num_r += comp(*--last, pivot);
                    }
                }

                // Swap elements and update block sizes and first/last boundaries.
                size_t num = std::min(num_l, num_r);
                swap_offsets(offsets_l_base, offsets_r_base,
                             offsets_l + start_l, offsets_r + start_r,
                             num, num_l == num_r);
                num_l -= num; num_r -= num;
                start_l += num; start_r += num;

                if (num_l == 0) {
                    start_l = 0;
                    offsets_l_base = first;
                }
                
                if (num_r == 0) {
                    start_r = 0;
                    offsets_r_base = last;
                }
            }

            // We have now fully identified [first, last)'s proper position. Swap the last elements.
            if (num_l) {
                offsets_l += start_l;
                while (num_l--) std::iter_swap(offsets_l_base + offsets_l[num_l], --last);
                first = last;
            }
            if (num_r) {
                offsets_r += start_r;
                while (num_r--) std::iter_swap(offsets_r_base - offsets_r[num_r], first), ++first;
                last = first;
            }
        }

        // Put the pivot in the right place.
        Iter pivot_pos = first - 1;
        *begin = PDQSORT_PREFER_MOVE(*pivot_pos);
        *pivot_pos = PDQSORT_PREFER_MOVE(pivot);

        return std::make_pair(pivot_pos, already_partitioned);
    }